

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void decompressBlockTHUMB59Tc
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint8 paint_colors [4] [3];
  uint8 colors [2] [3];
  byte local_36;
  byte local_35;
  uint local_34;
  
  local_36 = (byte)(block_part1 >> 0x17) & 0xf;
  local_35 = (byte)(block_part1 >> 0x13) & 0xf;
  local_34 = (block_part1 >> 0xf & 0xff0000ff | (block_part1 >> 0xb & 0xff) << 8 |
              (block_part1 >> 7 & 0xff) << 0x10 | (block_part1 >> 3 & 0x1f) << 0x18) &
             (uint)DAT_002fe350;
  decompressColor(4,4,4,(uint8 (*) [3])&local_36,colors);
  calculatePaintColors59T((byte)block_part1 & 7,'\x01',colors,paint_colors);
  iVar2 = (width * starty + startx) * channels;
  iVar1 = 0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    iVar4 = iVar2;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      uVar6 = iVar1 + (int)lVar5;
      uVar6 = (uint)((block_part2 >> (uVar6 & 0x1f) & 1) != 0) +
              (block_part2 >> ((byte)uVar6 & 0x1f | 0x10) & 1) * 2;
      img[iVar4] = paint_colors[uVar6][0];
      img[(long)iVar4 + 1] = paint_colors[uVar6][1];
      img[(long)iVar4 + 2] = paint_colors[uVar6][2];
      iVar4 = iVar4 + channels * width;
    }
    iVar2 = iVar2 + channels;
    iVar1 = iVar1 + 4;
  }
  return;
}

Assistant:

void decompressBlockTHUMB59Tc(unsigned int block_part1, unsigned int block_part2, uint8 *img,int width,int height,int startx,int starty, int channels)
{
	uint8 colorsRGB444[2][3];
	uint8 colors[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];

	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 58);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 54);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 50);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 46);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 42);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 38);

	distance   = GETBITSHIGH(block_part1, TABLE_BITS_59T, 34);

	// Extend the two colors to RGB888	
	decompressColor(R_BITS59T, G_BITS59T, B_BITS59T, colorsRGB444, colors);	
	calculatePaintColors59T(distance, PATTERN_T, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channels*((starty+y)*width+startx+x)+R] =
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channels*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channels*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
		}
	}
}